

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void Catch::cleanupSingletons(void)

{
  bool bVar1;
  iterator this;
  reference ppIVar2;
  ISingleton *singleton;
  iterator __end1;
  iterator __begin1;
  vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_> *__range1;
  vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_> **singletons;
  vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_> *in_stack_ffffffffffffffc8;
  vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_> *pvVar3;
  __normal_iterator<Catch::ISingleton_**,_std::vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<Catch::ISingleton_**,_std::vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>_>
  local_18;
  vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_> *local_10;
  vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_> **local_8;
  
  local_8 = anon_unknown_1::getSingletons();
  local_10 = *local_8;
  local_18._M_current =
       (ISingleton **)
       clara::std::vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  this = clara::std::vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>::end
                   (in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffd0,
                       (__normal_iterator<Catch::ISingleton_**,_std::vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<Catch::ISingleton_**,_std::vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>_>
              ::operator*(&local_18);
    in_stack_ffffffffffffffd0 =
         (__normal_iterator<Catch::ISingleton_**,_std::vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>_>
          *)*ppIVar2;
    if (in_stack_ffffffffffffffd0 !=
        (__normal_iterator<Catch::ISingleton_**,_std::vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>_>
         *)0x0) {
      (*(code *)in_stack_ffffffffffffffd0->_M_current[1])();
    }
    __gnu_cxx::
    __normal_iterator<Catch::ISingleton_**,_std::vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>_>
    ::operator++(&local_18);
  }
  pvVar3 = *local_8;
  if (pvVar3 != (vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_> *)0x0) {
    clara::std::vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>::~vector
              ((vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_> *)this._M_current)
    ;
    operator_delete(pvVar3,0x18);
  }
  *local_8 = (vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_> *)0x0;
  return;
}

Assistant:

void cleanupSingletons() {
        auto& singletons = getSingletons();
        for( auto singleton : *singletons )
            delete singleton;
        delete singletons;
        singletons = nullptr;
    }